

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandMfs3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Sfm_Par_t Pars;
  Sfm_Par_t local_b0;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  Sfm_ParSetDefault3(&local_b0);
  Extra_UtilGetoptReset();
LAB_00250dd6:
  iVar1 = Extra_UtilGetopt(argc,argv,"IOVFKLHRMCNPWDEarmzoespdlvwh");
  iVar6 = globalUtilOptind;
  if (0x37 < iVar1 - 0x43U) {
    if (iVar1 == -1) {
      if (local_38 == (Abc_Ntk_t *)0x0) {
        pcVar5 = "Empty network.\n";
      }
      else {
        if ((local_38->ntkFunc == ABC_FUNC_MAP) && (local_38->ntkType == ABC_NTK_LOGIC)) {
          Abc_NtkPerformMfs3(local_38,&local_b0);
          return 0;
        }
        pcVar5 = "This command can only be applied to a mapped logic network.\n";
      }
      iVar6 = -1;
      goto LAB_002514aa;
    }
    goto switchD_00250dfb_caseD_47;
  }
  piVar3 = &local_b0.fArea;
  switch(iVar1) {
  case 0x43:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nBTLimit = uVar2;
LAB_002510b2:
      globalUtilOptind = iVar6 + 1;
      if ((int)uVar2 < 0) goto switchD_00250dfb_caseD_47;
      goto LAB_00250dd6;
    }
    pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
    break;
  case 0x44:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.DeltaCrit = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.DelAreaRatio = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-E\" should be followed by an integer.\n";
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nFanoutMax = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  default:
    goto switchD_00250dfb_caseD_47;
  case 0x48:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nMffcMax = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-H\" should be followed by an integer.\n";
    break;
  case 0x49:
    if (globalUtilOptind < argc) {
      local_b0.nTfiLevMax = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar6 + 1;
      if (0 < local_b0.nTfiLevMax) goto LAB_00250dd6;
      pcVar5 = "The number of TFI levels (switch \"-I\") should be at least 1.\n";
    }
    else {
      pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
    }
    break;
  case 0x4b:
    if (globalUtilOptind < argc) {
      local_b0.nVarMax = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar6 + 1;
      if (local_b0.nVarMax - 9U < 0xfffffff9) goto switchD_00250dfb_caseD_47;
      goto LAB_00250dd6;
    }
    pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nMffcMin = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nWinSizeMax = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-M\" should be followed by an integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nNodesMax = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x4f:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nTfoLevMax = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-O\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.iNodeOne = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b0.nDecMax = uVar2;
      goto LAB_002510b2;
    }
    pcVar5 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x56:
    if (globalUtilOptind < argc) {
      local_b0.nTfoLevMax = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar6 + 1;
      local_b0.nTfiLevMax = local_b0.nTfoLevMax;
      if (local_b0.nTfoLevMax < 1) goto switchD_00250dfb_caseD_47;
      goto LAB_00250dd6;
    }
    pcVar5 = "Command line switch \"-V\" should be followed by an integer.\n";
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
      break;
    }
    local_b0.nTimeWin = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    if (100 < (uint)local_b0.nTimeWin) {
switchD_00250dfb_caseD_47:
      Abc_Print(-2,"usage: mfs3 [-IOVFKLHRMCNPWDE <num>] [-armzespdlvwh]\n");
      Abc_Print(-2,"\t           performs don\'t-care-based optimization of mapped networks\n");
      Abc_Print(-2,"\t-I <num> : the number of levels in the TFI cone (1 <= num) [default = %d]\n",
                (ulong)(uint)local_b0.nTfiLevMax);
      Abc_Print(-2,"\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
                (ulong)(uint)local_b0.nTfoLevMax);
      Abc_Print(-2,
                "\t-V <num> : the number of levels in the TFI/TFO cone (1 <= num) [default = %d]\n",
                (ulong)(uint)local_b0.nTfiLevMax);
      Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
                (ulong)(uint)local_b0.nFanoutMax);
      Abc_Print(-2,"\t-K <num> : the max number of variables (2 <= num <= 8 ) [default = %d]\n",
                (ulong)(uint)local_b0.nVarMax);
      Abc_Print(-2,
                "\t-L <num> : the min size of max fanout-free cone (MFFC) (area-only) [default = %d]\n"
                ,(ulong)(uint)local_b0.nMffcMin);
      Abc_Print(-2,
                "\t-H <num> : the max size of max fanout-free cone (MFFC) (area-only) [default = %d]\n"
                ,(ulong)(uint)local_b0.nMffcMax);
      Abc_Print(-2,
                "\t-R <num> : the max number of decomposition rounds (1 <= num <= 4) [default = %d]\n"
                ,(ulong)(uint)local_b0.nDecMax);
      Abc_Print(-2,
                "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)local_b0.nWinSizeMax);
      Abc_Print(-2,
                "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)local_b0.nBTLimit);
      Abc_Print(-2,"\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",
                (ulong)(uint)local_b0.nNodesMax);
      Abc_Print(-2,"\t-P <num> : one particular node to try (0 = none) [default = %d]\n",
                (ulong)(uint)local_b0.iNodeOne);
      Abc_Print(-2,
                "\t-W <num> : size of timing window in percents (0 <= num <= 100) [default = %d]\n",
                (ulong)(uint)local_b0.nTimeWin);
      Abc_Print(-2,
                "\t-D <num> : size of critical-timing delay-delta (in picoseconds) [default = %d]\n"
                ,(ulong)(uint)local_b0.DeltaCrit);
      Abc_Print(-2,
                "\t-E <num> : delay-area tradeoff (in picoseconds per area-unit) [default = %d]\n",
                (ulong)(uint)local_b0.DelAreaRatio);
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (local_b0.fArea == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-a       : toggle area minimization [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b0.fAreaRev == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-r       : toggle using reverse topo order for area minimization [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_b0.fUseAndOr == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m       : toggle detecting multi-input AND/OR gates [default = %s]\n",pcVar5)
      ;
      pcVar5 = "yes";
      if (local_b0.fZeroCost == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-z       : toggle zero-cost replacements [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b0.fMoreEffort == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-e       : toggle using more effort [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b0.fUseSim == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-s       : toggle using simulation [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b0.fPrintDecs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-p       : toggle printing decompositions [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b0.fDelayVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle printing delay profile statistics [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b0.fLibVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-l       : toggle printing library usage statistics [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b0.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar5);
      if (local_b0.fVeryVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar4);
      pcVar5 = "\t-h       : print the command usage\n";
      iVar6 = -2;
LAB_002514aa:
      Abc_Print(iVar6,pcVar5);
      return 1;
    }
    goto LAB_00250dd6;
  case 0x61:
    goto switchD_00250dfb_caseD_61;
  case 100:
    piVar3 = &local_b0.fDelayVerbose;
    goto switchD_00250dfb_caseD_61;
  case 0x65:
    piVar3 = &local_b0.fMoreEffort;
    goto switchD_00250dfb_caseD_61;
  case 0x6c:
    piVar3 = &local_b0.fLibVerbose;
    goto switchD_00250dfb_caseD_61;
  case 0x6d:
    piVar3 = &local_b0.fUseAndOr;
    goto switchD_00250dfb_caseD_61;
  case 0x6f:
    piVar3 = &local_b0.fRrOnly;
    goto switchD_00250dfb_caseD_61;
  case 0x70:
    piVar3 = &local_b0.fPrintDecs;
    goto switchD_00250dfb_caseD_61;
  case 0x72:
    piVar3 = &local_b0.fAreaRev;
    goto switchD_00250dfb_caseD_61;
  case 0x73:
    piVar3 = &local_b0.fUseSim;
    goto switchD_00250dfb_caseD_61;
  case 0x76:
    piVar3 = &local_b0.fVerbose;
    goto switchD_00250dfb_caseD_61;
  case 0x77:
    piVar3 = &local_b0.fVeryVerbose;
    goto switchD_00250dfb_caseD_61;
  case 0x7a:
    piVar3 = &local_b0.fZeroCost;
switchD_00250dfb_caseD_61:
    *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    goto LAB_00250dd6;
  }
  Abc_Print(-1,pcVar5);
  goto switchD_00250dfb_caseD_47;
}

Assistant:

int Abc_CommandMfs3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkPerformMfs3( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars );
    extern void Sfm_ParSetDefault3( Sfm_Par_t * pPars );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Sfm_Par_t Pars, * pPars = &Pars; int c;
    // set defaults
    Sfm_ParSetDefault3( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOVFKLHRMCNPWDEarmzoespdlvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfiLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfiLevMax < 1 )
            {
                Abc_Print( -1, "The number of TFI levels (switch \"-I\") should be at least 1.\n" );
                goto usage;
            }
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfiLevMax = pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfiLevMax < 1 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVarMax < 2 || pPars->nVarMax > 8 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMffcMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMffcMin < 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMffcMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMffcMax < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDecMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDecMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinSizeMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodesMax < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->iNodeOne = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->iNodeOne < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeWin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeWin < 0 || pPars->nTimeWin > 100 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->DeltaCrit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DeltaCrit < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->DelAreaRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelAreaRatio < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'r':
            pPars->fAreaRev ^= 1;
            break;
        case 'm':
            pPars->fUseAndOr ^= 1;
            break;
        case 'z':
            pPars->fZeroCost ^= 1;
            break;
        case 'o':
            pPars->fRrOnly ^= 1;
            break;
        case 'e':
            pPars->fMoreEffort ^= 1;
            break;
        case 's':
            pPars->fUseSim ^= 1;
            break;
        case 'p':
            pPars->fPrintDecs ^= 1;
            break;
        case 'd':
            pPars->fDelayVerbose ^= 1;
            break;
        case 'l':
            pPars->fLibVerbose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsMappedLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a mapped logic network.\n" );
        return 1;
    }
    // modify the current network
    Abc_NtkPerformMfs3( pNtk, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: mfs3 [-IOVFKLHRMCNPWDE <num>] [-armzespdlvwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of mapped networks\n" );
    Abc_Print( -2, "\t-I <num> : the number of levels in the TFI cone (1 <= num) [default = %d]\n",             pPars->nTfiLevMax );
    Abc_Print( -2, "\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-V <num> : the number of levels in the TFI/TFO cone (1 <= num) [default = %d]\n",         pPars->nTfiLevMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-K <num> : the max number of variables (2 <= num <= 8 ) [default = %d]\n",                pPars->nVarMax );
    Abc_Print( -2, "\t-L <num> : the min size of max fanout-free cone (MFFC) (area-only) [default = %d]\n",     pPars->nMffcMin );
    Abc_Print( -2, "\t-H <num> : the max size of max fanout-free cone (MFFC) (area-only) [default = %d]\n",     pPars->nMffcMax );
    Abc_Print( -2, "\t-R <num> : the max number of decomposition rounds (1 <= num <= 4) [default = %d]\n",      pPars->nDecMax );
    Abc_Print( -2, "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n",    pPars->nWinSizeMax );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",                    pPars->nNodesMax );
    Abc_Print( -2, "\t-P <num> : one particular node to try (0 = none) [default = %d]\n",                       pPars->iNodeOne );
    Abc_Print( -2, "\t-W <num> : size of timing window in percents (0 <= num <= 100) [default = %d]\n",         pPars->nTimeWin );
    Abc_Print( -2, "\t-D <num> : size of critical-timing delay-delta (in picoseconds) [default = %d]\n",        pPars->DeltaCrit );
    Abc_Print( -2, "\t-E <num> : delay-area tradeoff (in picoseconds per area-unit) [default = %d]\n",          pPars->DelAreaRatio );
    Abc_Print( -2, "\t-a       : toggle area minimization [default = %s]\n",                                    pPars->fArea? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle using reverse topo order for area minimization [default = %s]\n",       pPars->fAreaRev? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggle detecting multi-input AND/OR gates [default = %s]\n",                   pPars->fUseAndOr? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggle zero-cost replacements [default = %s]\n",                               pPars->fZeroCost? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggle using more effort [default = %s]\n",                                    pPars->fMoreEffort? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle using simulation [default = %s]\n",                                     pPars->fUseSim? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggle printing decompositions [default = %s]\n",                              pPars->fPrintDecs? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggle printing delay profile statistics [default = %s]\n",                    pPars->fDelayVerbose? "yes": "no" );
    Abc_Print( -2, "\t-l       : toggle printing library usage statistics [default = %s]\n",                    pPars->fLibVerbose? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}